

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O0

void __thiscall MapLoader::MapLoader(MapLoader *this,string *mapFile)

{
  string *this_00;
  string *mapFile_local;
  MapLoader *this_local;
  
  this->_vptr_MapLoader = (_func_int **)&PTR__MapLoader_00169a70;
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00,(string *)mapFile);
  this->pMapFile = this_00;
  return;
}

Assistant:

MapLoader::MapLoader(std::string mapFile) {
    pMapFile = new std::string(std::move(mapFile));
}